

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_isBaseUnitAllStandardUnits_Test::TestBody(Units_isBaseUnitAllStandardUnits_Test *this)

{
  allocator<unsigned_long> *this_00;
  initializer_list<unsigned_long> __l;
  initializer_list<libcellml::Units::StandardUnit> __l_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  element_type *peVar4;
  const_iterator __first;
  const_iterator __last;
  AssertionResult local_308 [2];
  AssertHelper local_2e8 [8];
  Message local_2e0 [15];
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_2a0 [8];
  Message local_298 [15];
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_260;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  found;
  UnitsPtr testUnit;
  const_iterator cStack_240;
  StandardUnit standardUnit;
  const_iterator __end1;
  const_iterator __begin1;
  vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_> *__range1;
  size_t index;
  double uExp;
  double expMult;
  string id;
  string pre;
  string ref;
  UnitsPtr u;
  Message local_198 [8];
  size_type local_190;
  unsigned_long local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  Message local_168 [8];
  size_type local_160;
  unsigned_long local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  unsigned_long local_138 [8];
  iterator local_f8;
  size_type local_f0;
  undefined1 local_e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> baseUnitIndices;
  allocator<libcellml::Units::StandardUnit> local_b9;
  StandardUnit local_b8 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
  standardUnits;
  Units_isBaseUnitAllStandardUnits_Test *this_local;
  
  local_b8[0x1c] = 0x1c;
  local_b8[0x1d] = WATT;
  local_b8[0x1e] = WEBER;
  local_b8[0x18] = SIEMENS;
  local_b8[0x19] = SIEVERT;
  local_b8[0x1a] = 0x1a;
  local_b8[0x1b] = 0x1b;
  local_b8[0x14] = OHM;
  local_b8[0x15] = PASCAL;
  local_b8[0x16] = RADIAN;
  local_b8[0x17] = SECOND;
  local_b8[0x10] = LUX;
  local_b8[0x11] = METRE;
  local_b8[0x12] = MOLE;
  local_b8[0x13] = NEWTON;
  local_b8[0xc] = KELVIN;
  local_b8[0xd] = KILOGRAM;
  local_b8[0xe] = LITRE;
  local_b8[0xf] = LUMEN;
  local_b8[8] = HENRY;
  local_b8[9] = HERTZ;
  local_b8[10] = JOULE;
  local_b8[0xb] = KATAL;
  local_b8[4] = DIMENSIONLESS;
  local_b8[5] = FARAD;
  local_b8[6] = GRAM;
  local_b8[7] = GRAY;
  local_b8[0] = AMPERE;
  local_b8[1] = BECQUEREL;
  local_b8[2] = CANDELA;
  local_b8[3] = COULOMB;
  local_38 = local_b8;
  local_30 = 0x1f;
  standardUnits.
  super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<libcellml::Units::StandardUnit>::allocator(&local_b9);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>::
  vector((vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_> *)
         local_28,__l_00,&local_b9);
  std::allocator<libcellml::Units::StandardUnit>::~allocator(&local_b9);
  local_138[6] = 0x12;
  local_138[7] = 0x17;
  local_138[4] = 0xd;
  local_138[5] = 0x11;
  local_138[2] = 4;
  local_138[3] = 0xc;
  local_138[0] = 0;
  local_138[1] = 2;
  local_f8 = local_138;
  local_f0 = 8;
  this_00 = (allocator<unsigned_long> *)((long)&gtest_ar.message_.ptr_ + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8,__l,this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_158 = 0x1f;
  local_160 = std::
              vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
              ::size((vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                      *)local_28);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_150,"size_t(31)","standardUnits.size()",&local_158,&local_160)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x89a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_188 = 8;
  local_190 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_180,"size_t(8)","baseUnitIndices.size()",&local_188,&local_190
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x89b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_198);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    testing::Message::~Message(local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  libcellml::Units::create();
  std::__cxx11::string::string((string *)(pre.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(id.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&expMult);
  __range1 = (vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
              *)0x0;
  __end1 = std::
           vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>::
           begin((vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                  *)local_28);
  cStack_240 = std::
               vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
               ::end((vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                      *)local_28);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffdc0), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_libcellml::Units::StandardUnit_*,_std::vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>_>
    ::operator*(&__end1);
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(ref.field_2._M_local_buf + 8));
    libcellml::Units::addUnit((StandardUnit)peVar4);
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(ref.field_2._M_local_buf + 8));
    libcellml::Units::unitAttributes
              ((ulong)peVar4,(string *)0x0,(string *)(pre.field_2._M_local_buf + 8),
               (double *)((long)&id.field_2 + 8),(double *)&index,(string *)&uExp);
    libcellml::Units::create((string *)&found);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
    local_260 = std::
                find<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (__first._M_current,__last._M_current,(unsigned_long *)&__range1);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
    bVar1 = __gnu_cxx::operator!=
                      (&local_260,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&gtest_ar_.message_);
    if (bVar1) {
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &found);
      bVar2 = libcellml::Units::isBaseUnit();
      local_289 = (bool)(bVar2 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_288,&local_289,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
      if (!bVar1) {
        testing::Message::Message(local_298);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)&gtest_ar__1.message_,local_288,"testUnit->isBaseUnit()",
                   "false");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                   ,0x8ac,pcVar3);
        testing::internal::AssertHelper::operator=(local_2a0,local_298);
        testing::internal::AssertHelper::~AssertHelper(local_2a0);
        std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
        testing::Message::~Message(local_298);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    }
    else {
      std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &found);
      bVar2 = libcellml::Units::isBaseUnit();
      local_2d1 = (bool)(~bVar2 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
      if (!bVar1) {
        testing::Message::Message(local_2e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_308,local_2d0,"testUnit->isBaseUnit()","true");
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_2e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                   ,0x8ae,pcVar3);
        testing::internal::AssertHelper::operator=(local_2e8,local_2e0);
        testing::internal::AssertHelper::~AssertHelper(local_2e8);
        std::__cxx11::string::~string((string *)local_308);
        testing::Message::~Message(local_2e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
    }
    peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(ref.field_2._M_local_buf + 8));
    libcellml::Units::removeUnit((StandardUnit)peVar4);
    __range1 = (vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                *)((long)&(__range1->
                          super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&found);
    __gnu_cxx::
    __normal_iterator<const_libcellml::Units::StandardUnit_*,_std::vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)&expMult);
  std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(pre.field_2._M_local_buf + 8));
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)((long)&ref.field_2 + 8));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_e8);
  std::vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>::
  ~vector((vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_> *
          )local_28);
  return;
}

Assistant:

TEST(Units, isBaseUnitAllStandardUnits)
{
    const std::vector<libcellml::Units::StandardUnit> standardUnits = {
        libcellml::Units::StandardUnit::AMPERE,
        libcellml::Units::StandardUnit::BECQUEREL,
        libcellml::Units::StandardUnit::CANDELA,
        libcellml::Units::StandardUnit::COULOMB,
        libcellml::Units::StandardUnit::DIMENSIONLESS,
        libcellml::Units::StandardUnit::FARAD,
        libcellml::Units::StandardUnit::GRAM,
        libcellml::Units::StandardUnit::GRAY,
        libcellml::Units::StandardUnit::HENRY,
        libcellml::Units::StandardUnit::HERTZ,
        libcellml::Units::StandardUnit::JOULE,
        libcellml::Units::StandardUnit::KATAL,
        libcellml::Units::StandardUnit::KELVIN,
        libcellml::Units::StandardUnit::KILOGRAM,
        libcellml::Units::StandardUnit::LITRE,
        libcellml::Units::StandardUnit::LUMEN,
        libcellml::Units::StandardUnit::LUX,
        libcellml::Units::StandardUnit::METRE,
        libcellml::Units::StandardUnit::MOLE,
        libcellml::Units::StandardUnit::NEWTON,
        libcellml::Units::StandardUnit::OHM,
        libcellml::Units::StandardUnit::PASCAL,
        libcellml::Units::StandardUnit::RADIAN,
        libcellml::Units::StandardUnit::SECOND,
        libcellml::Units::StandardUnit::SIEMENS,
        libcellml::Units::StandardUnit::SIEVERT,
        libcellml::Units::StandardUnit::STERADIAN,
        libcellml::Units::StandardUnit::TESLA,
        libcellml::Units::StandardUnit::VOLT,
        libcellml::Units::StandardUnit::WATT,
        libcellml::Units::StandardUnit::WEBER,
    };

    const std::vector<size_t> baseUnitIndices = {0, 2, 4, 12, 13, 17, 18, 23};

    EXPECT_EQ(size_t(31), standardUnits.size());
    EXPECT_EQ(size_t(8), baseUnitIndices.size());

    libcellml::UnitsPtr u = libcellml::Units::create();
    std::string ref;
    std::string pre;
    std::string id;
    double expMult;
    double uExp;

    size_t index = 0;
    for (auto standardUnit : standardUnits) {
        u->addUnit(standardUnit);
        u->unitAttributes(0, ref, pre, uExp, expMult, id);

        libcellml::UnitsPtr testUnit = libcellml::Units::create(ref);
        auto found = std::find(baseUnitIndices.begin(), baseUnitIndices.end(), index);
        if (found != baseUnitIndices.end()) {
            EXPECT_TRUE(testUnit->isBaseUnit());
        } else {
            EXPECT_FALSE(testUnit->isBaseUnit());
        }

        u->removeUnit(standardUnit);
        index++;
    }
}